

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CZ<std::complex<double>_>::CZ
          (CZ<std::complex<double>_> *this,int control,int target,int controlState)

{
  int controlState_local;
  int target_local;
  int control_local;
  CZ<std::complex<double>_> *this_local;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075b1e0;
  std::make_unique<qclab::qgates::PauliZ<std::complex<double>>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                  ,0x2b,
                  "qclab::qgates::CZ<std::complex<double>>::CZ(const int, const int, const int) [T = std::complex<double>]"
                 );
  }
  if (-1 < target) {
    if (control != target) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                  ,0x2c,
                  "qclab::qgates::CZ<std::complex<double>>::CZ(const int, const int, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                ,0x2b,
                "qclab::qgates::CZ<std::complex<double>>::CZ(const int, const int, const int) [T = std::complex<double>]"
               );
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }